

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O0

void rsg::anon_unknown_27::createAssignment(BlockStatement *block,Variable *dstVar,Variable *srcVar)

{
  VariableRead *this;
  AssignStatement *this_00;
  exception *anon_var_0;
  VariableRead *varRead;
  Variable *srcVar_local;
  Variable *dstVar_local;
  BlockStatement *block_local;
  
  this = (VariableRead *)operator_new(0x20);
  VariableRead::VariableRead(this,srcVar);
  this_00 = (AssignStatement *)operator_new(0x18);
  AssignStatement::AssignStatement(this_00,dstVar,(Expression *)this);
  BlockStatement::addChild(block,(Statement *)this_00);
  return;
}

Assistant:

void createAssignment (BlockStatement& block, const Variable* dstVar, const Variable* srcVar)
{
	VariableRead* varRead = new VariableRead(srcVar);
	try
	{
		block.addChild(new AssignStatement( dstVar, varRead));
	}
	catch (const std::exception&)
	{
		delete varRead;
		throw;
	}
}